

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O1

symbol * evaluate_string(dmr_C *C,expression *expr)

{
  byte *pbVar1;
  allocator *A;
  position pVar2;
  symbol *psVar3;
  symbol *psVar4;
  symbol *psVar5;
  expression *peVar6;
  scope *psVar7;
  uint uVar8;
  
  psVar3 = dmrC_alloc_symbol(C->S,expr->pos,3);
  psVar4 = dmrC_alloc_symbol(C->S,expr->pos,6);
  pVar2 = expr->pos;
  A = &C->expression_allocator;
  psVar5 = (symbol *)dmrC_allocator_allocate(A,0);
  *(undefined1 *)psVar5 = 3;
  *(position *)&(psVar5->pos).field_0x4 = pVar2;
  pVar2 = expr->pos;
  peVar6 = (expression *)dmrC_allocator_allocate(A,0);
  *(undefined1 *)peVar6 = 2;
  peVar6->pos = pVar2;
  pVar2 = expr->pos;
  uVar8 = (uint)*(expr->field_5).field_2.string & 0x7fffffff;
  psVar7 = (scope *)dmrC_allocator_allocate(A,0);
  *(undefined1 *)&psVar7->token = 1;
  psVar7->symbols = (symbol_list *)pVar2;
  psVar7[1].symbols = (symbol_list *)(ulong)uVar8;
  psVar7->next = (scope *)&C->S->int_ctype;
  (psVar3->field_14).field_0.used_in = psVar7;
  (psVar3->field_14).field_1.normal = C->target->bits_in_char * uVar8;
  (psVar3->field_14).field_2.ctype.alignment = 1;
  pbVar1 = (byte *)((long)&psVar3->field_14 + 0xe);
  *pbVar1 = *pbVar1 | 0x80;
  (psVar3->field_14).field_2.ctype.modifiers = 4;
  (psVar3->field_14).field_2.ctype.base_type = psVar4;
  (psVar3->field_14).field_2.initializer = peVar6;
  peVar6->ctype = psVar3;
  (peVar6->field_5).field_2.string = (expr->field_5).field_2.string;
  (psVar4->field_14).field_0.used_in = (psVar3->field_14).field_0.used_in;
  (psVar4->field_14).field_1.normal = C->target->bits_in_char * uVar8;
  (psVar4->field_14).field_2.ctype.alignment = 1;
  (psVar4->field_14).field_2.ctype.modifiers = 4;
  (psVar4->field_14).field_2.ctype.base_type = &C->S->char_ctype;
  psVar5->next_id = psVar3;
  *(symbol **)&(psVar5->endpos).field_0x4 = &C->S->lazy_ptr_ctype;
  *(undefined1 *)expr = 9;
  expr->op = 0x2a;
  (expr->field_5).field_4.symbol = psVar5;
  expr->ctype = psVar3;
  return psVar3;
}

Assistant:

static struct symbol *evaluate_string(struct dmr_C *C, struct expression *expr)
{
	struct symbol *sym = dmrC_alloc_symbol(C->S, expr->pos, SYM_NODE);
	struct symbol *array = dmrC_alloc_symbol(C->S, expr->pos, SYM_ARRAY);
	struct expression *addr = dmrC_alloc_expression(C, expr->pos, EXPR_SYMBOL);
	struct expression *initstr = dmrC_alloc_expression(C, expr->pos, EXPR_STRING);
	unsigned int length = expr->string->length;

	sym->array_size = dmrC_alloc_const_expression(C, expr->pos, length);
	sym->bit_size = dmrC_bytes_to_bits(C->target, length);
	sym->ctype.alignment = 1;
	sym->string = 1;
	sym->ctype.modifiers = MOD_STATIC;
	sym->ctype.base_type = array;
	sym->initializer = initstr;

	initstr->ctype = sym;
	initstr->string = expr->string;

	array->array_size = sym->array_size;
	array->bit_size = dmrC_bytes_to_bits(C->target, length);
	array->ctype.alignment = 1;
	array->ctype.modifiers = MOD_STATIC;
	array->ctype.base_type = &C->S->char_ctype;
	
	addr->symbol = sym;
	addr->ctype = &C->S->lazy_ptr_ctype;

	expr->type = EXPR_PREOP;
	expr->op = '*';
	expr->unop = addr;  
	expr->ctype = sym;
	return sym;
}